

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadCertificate.h
# Opt level: O1

string * generate_cert(string *__return_storage_ptr__,string *domain_name,string *main_dirpath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *main_dirpath_00;
  char cVar2;
  int iVar3;
  long *plVar4;
  path *__p;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  pointer unaff_RBX;
  bool bVar8;
  string path_string;
  string ext_filepath;
  string crt_dirpath;
  string command;
  path local_328;
  string local_300;
  directory_iterator local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string *local_2a0;
  string_type local_298;
  string *local_278;
  long *local_270 [2];
  long local_260 [2];
  long *local_250;
  size_t local_248;
  long local_240 [2];
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_2a0 = __return_storage_ptr__;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&mut);
  if (iVar3 != 0) {
    uVar5 = std::__throw_system_error(iVar3);
    if (local_328._M_pathname._M_dataplus._M_p != unaff_RBX) {
      operator_delete(local_328._M_pathname._M_dataplus._M_p,
                      local_328._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&mut);
    _Unwind_Resume(uVar5);
  }
  paVar1 = &local_328._M_pathname.field_2;
  local_328._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"/","");
  plVar4 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_328,0,(char *)0x0,
                              (ulong)(main_dirpath->_M_dataplus)._M_p);
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar6) {
    local_220[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_220[0]._8_8_ = plVar4[3];
    local_230 = (undefined1  [8])local_220;
  }
  else {
    local_220[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_230 = (undefined1  [8])*plVar4;
  }
  local_228 = plVar4[1];
  *plVar4 = (long)paVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_230);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2c0.field_2._M_allocated_capacity = *psVar7;
    local_2c0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_2c0.field_2._M_allocated_capacity = *psVar7;
    local_2c0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_2c0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_328._M_pathname._M_dataplus._M_p,
                    local_328._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_230,&local_2c0,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_298,(path *)local_230,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path((path *)local_230);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_298._M_string_length + 8) =
           *(_Atomic_word *)(local_298._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_298._M_string_length + 8) =
           *(_Atomic_word *)(local_298._M_string_length + 8) + 1;
    }
  }
  local_2e0._M_dir._M_ptr = (element_type *)local_298._M_dataplus._M_p;
  local_2e0._M_dir._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_298._M_string_length + 8) =
           *(_Atomic_word *)(local_298._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_298._M_string_length + 8) =
           *(_Atomic_word *)(local_298._M_string_length + 8) + 1;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length);
    }
  }
  local_278 = main_dirpath;
  do {
    main_dirpath_00 = local_278;
    if (local_2e0._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length);
      }
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,local_2c0._M_dataplus._M_p,
                 local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
      std::__cxx11::string::append((char *)&local_300);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_300,(ulong)(domain_name->_M_dataplus)._M_p);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_328._M_pathname.field_2._M_allocated_capacity = *psVar7;
        local_328._M_pathname.field_2._8_8_ = plVar4[3];
        local_328._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_328._M_pathname.field_2._M_allocated_capacity = *psVar7;
        local_328._M_pathname._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_328._M_pathname._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::filesystem::__cxx11::path::path((path *)local_230,&local_328._M_pathname,auto_format);
      std::filesystem::create_directories((path *)local_230);
      std::filesystem::__cxx11::path::~path((path *)local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_pathname._M_dataplus._M_p,
                        local_328._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      local_230 = (undefined1  [8])local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"domains.ext","");
      build_path(&local_300,&local_2c0,domain_name,(string *)local_230);
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
      }
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"/","");
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_270,0,(char *)0x0,
                                  (ulong)(main_dirpath_00->_M_dataplus)._M_p);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar6) {
        local_2d0._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_2d0._8_8_ = plVar4[3];
        local_2e0._M_dir._M_ptr = (element_type *)&local_2d0;
      }
      else {
        local_2d0._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_2e0._M_dir._M_ptr = (element_type *)*plVar4;
      }
      local_2e0._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1]
      ;
      *plVar4 = (long)paVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e0);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar6) {
        local_298.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_298.field_2._8_8_ = plVar4[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_298._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_298._M_string_length = plVar4[1];
      *plVar4 = (long)paVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::filesystem::__cxx11::path::path((path *)local_230,&local_298,auto_format);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_328,&local_300,auto_format);
      std::filesystem::copy((path *)local_230,&local_328,none);
      std::filesystem::__cxx11::path::~path(&local_328);
      std::filesystem::__cxx11::path::~path((path *)local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dir._M_ptr != &local_2d0) {
        operator_delete(local_2e0._M_dir._M_ptr,local_2d0._M_allocated_capacity + 1);
      }
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
      }
      std::ofstream::ofstream(local_230,(string *)&local_300,_S_app);
      std::operator+(&local_328._M_pathname,"DNS.1 = ",domain_name);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,local_328._M_pathname._M_dataplus._M_p,
                 local_328._M_pathname._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_pathname._M_dataplus._M_p,
                        local_328._M_pathname.field_2._M_allocated_capacity + 1);
      }
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _operator_delete__;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      build_path_command((string *)local_230,&local_2c0,domain_name,main_dirpath_00);
      system((char *)local_230);
      local_328._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"localhost.crt","");
      build_path(local_2a0,&local_2c0,domain_name,&local_328._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_pathname._M_dataplus._M_p,
                        local_328._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
LAB_00110627:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&mut);
      return local_2a0;
    }
    __p = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_2e0);
    std::filesystem::__cxx11::path::path((path *)local_230,__p);
    local_328._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_328,local_230,(char *)((long)local_230 + local_228));
    std::__cxx11::string::rfind((char *)&local_328,0x158d38,0xffffffffffffffff);
    cVar2 = std::filesystem::status((path *)local_230);
    if ((cVar2 == '\x02') &&
       (std::__cxx11::string::substr((ulong)&local_250,(ulong)&local_328),
       local_248 == domain_name->_M_string_length)) {
      if (local_248 == 0) {
        bVar8 = true;
      }
      else {
        iVar3 = bcmp(local_250,(domain_name->_M_dataplus)._M_p,local_248);
        bVar8 = iVar3 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if ((cVar2 == '\x02') && (local_250 != local_240)) {
      operator_delete(local_250,local_240[0] + 1);
    }
    if (bVar8) {
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"localhost.crt","");
      build_path(local_2a0,&local_2c0,domain_name,&local_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_pathname._M_dataplus._M_p,
                        local_328._M_pathname.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path((path *)local_230);
      if (bVar8) {
        if (local_2e0._M_dir._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_2e0._M_dir._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length);
        }
        goto LAB_00110627;
      }
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_pathname._M_dataplus._M_p,
                        local_328._M_pathname.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path((path *)local_230);
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_2e0);
  } while( true );
}

Assistant:

std::string generate_cert(const std::string& domain_name,
                            const std::string& main_dirpath) {
    std::lock_guard<std::mutex> m(mut);

    const std::string crt_dirpath = main_dirpath + std::string("/") + CERTS_DIRNAME;

    for(const auto& p : fs::directory_iterator(crt_dirpath)) {
        fs::path path = p.path();
        std::string path_string = path.string();
        size_t pos = path_string.rfind("/");
        if (fs::is_directory(path) && 
                path_string.substr(pos + 1, path_string.length()) == domain_name) {
            return build_path(crt_dirpath, domain_name, CRT_FILENAME);
        }
    }

    fs::create_directories(crt_dirpath + "/" + domain_name);

    std::string ext_filepath = build_path(crt_dirpath, domain_name, EXT_FILENAME);

    fs::copy(main_dirpath + std::string("/") + EXT_FILENAME, ext_filepath); {
        std::ofstream file(ext_filepath, std::ios::app);
        file << "DNS.1 = " + domain_name;
    }
    std::string command = build_path_command(crt_dirpath, domain_name, main_dirpath);

    int _ = std::system(command.c_str());

    return build_path(crt_dirpath, domain_name, CRT_FILENAME);
}